

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryEnumTypes_Test::TestBody
          (ValidationErrorTest_MapEntryEnumTypes_Test *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar1;
  Message *in_RCX;
  string_view input;
  FileDescriptorProto file_proto;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_108 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
  anon_unknown_532::FillValidMapEntry((FileDescriptorProto *)local_108);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     ((RepeatedPtrFieldBase *)(local_108 + 0x30),0);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,0);
  input._M_str = (char *)pVVar1;
  input._M_len = (size_t)"enum_type {   name: \'BarEnum\'   value { name: \'BAR_BAR\' number:0 } } "
  ;
  TextFormat::MergeFromString((TextFormat *)0x45,input,in_RCX);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120,
            "foo.proto: Foo.foo_map: TYPE: map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,(FileDescriptorProto *)local_108,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_120);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryEnumTypes) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  TextFormat::MergeFromString(
      "enum_type { "
      "  name: 'BarEnum' "
      "  value { name: 'BAR_BAR' number:0 } "
      "} ",
      file_proto.mutable_message_type(0)->mutable_nested_type(0));
  BuildFileWithErrors(file_proto, kMapEntryErrorMessage);
}